

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

QueryPoolWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateQueryPool
          (QueryPoolWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkQueryPoolCreateInfo *QueryPoolCI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (QueryPoolCI->sType != VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO) {
    Diligent::FormatString<char[26],char[62]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"QueryPoolCI.sType == VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO",
               (char (*) [62])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateQueryPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x17e);
    std::__cxx11::string::~string((string *)&local_48);
  }
  CreateVulkanObject<VkQueryPool_T*,(VulkanUtilities::VulkanHandleTypeId)20,VkResult(*)(VkDevice_T*,VkQueryPoolCreateInfo_const*,VkAllocationCallbacks_const*,VkQueryPool_T**),VkQueryPoolCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkQueryPoolCreateInfo_ptr_VkAllocationCallbacks_ptr_VkQueryPool_T_ptr_ptr
              *)vkCreateQueryPool,QueryPoolCI,DebugName,"query pool");
  return __return_storage_ptr__;
}

Assistant:

QueryPoolWrapper VulkanLogicalDevice::CreateQueryPool(const VkQueryPoolCreateInfo& QueryPoolCI, const char* DebugName) const
{
    VERIFY_EXPR(QueryPoolCI.sType == VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO);
    return CreateVulkanObject<VkQueryPool, VulkanHandleTypeId::QueryPool>(vkCreateQueryPool, QueryPoolCI, DebugName, "query pool");
}